

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall icu_63::Calendar::getRelatedYear(Calendar *this,UErrorCode *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char **ppcVar4;
  int iVar5;
  int i;
  long lVar6;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  complete(this,status);
  iVar5 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = this->fFields[0x13];
    iVar2 = (*(this->super_UObject)._vptr_UObject[0x17])(this);
    ppcVar4 = gCalTypes;
    lVar6 = 0;
    do {
      iVar3 = uprv_stricmp_63((char *)CONCAT44(extraout_var,iVar2),*ppcVar4);
      if (iVar3 == 0) goto LAB_001e6de3;
      lVar6 = lVar6 + 1;
      ppcVar4 = ppcVar4 + 1;
    } while (lVar6 != 0x12);
    lVar6 = 0xffffffff;
LAB_001e6de3:
    switch((int)lVar6) {
    case 4:
      iVar5 = iVar5 + 0x26e;
      break;
    case 5:
    case 6:
    case 0xf:
    case 0x10:
    case 0x11:
      if (iVar5 < 0x575) {
        uVar1 = (uint)((ulong)((long)(iVar5 + -0x574) * -0x7a44c6b) >> 0x20);
        iVar2 = (((uVar1 >> 1) - ((int)uVar1 >> 0x1f)) * 2 - (uint)((0x574U - iVar5) % 0x43 < 0x22))
                + 2;
      }
      else {
        iVar2 = (((iVar5 - 0x575U) % 0x43 < 0x21) - 1) -
                ((uint)((ulong)(iVar5 - 0x575U) * 0x7a44c6b >> 0x20) & 0xfffffffe);
      }
      return iVar2 + iVar5 + 0x243;
    case 7:
      iVar5 = iVar5 + -0xeb0;
      break;
    case 8:
      iVar5 = iVar5 + -0xa4d;
      break;
    case 9:
      iVar5 = iVar5 + 0x4f;
      break;
    case 10:
      iVar5 = iVar5 + 0x11c;
      break;
    case 0xb:
      iVar5 = iVar5 + 8;
      break;
    case 0xc:
      iVar5 = iVar5 + -0x1574;
      break;
    case 0xe:
      iVar5 = iVar5 + -0x91d;
    }
  }
  return iVar5;
}

Assistant:

int32_t Calendar::getRelatedYear(UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t year = get(UCAL_EXTENDED_YEAR, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year += 622; break;
        case CALTYPE_HEBREW:
            year -= 3760; break;
        case CALTYPE_CHINESE:
            year -= 2637; break;
        case CALTYPE_INDIAN:
            year += 79; break;
        case CALTYPE_COPTIC:
            year += 284; break;
        case CALTYPE_ETHIOPIC:
            year += 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year -=5492; break;
        case CALTYPE_DANGI:
            year -= 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = gregoYearFromIslamicStart(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    return year;
}